

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O0

void sigmund_npts(t_sigmund *x,t_floatarg f)

{
  int iVar1;
  uint uVar2;
  t_sample *ptVar3;
  int local_1c;
  int npts;
  int nwas;
  t_floatarg f_local;
  t_sigmund *x_local;
  
  iVar1 = x->x_npts;
  local_1c = (int)f;
  if (local_1c < 0x80) {
    post("sigmund~: minimum points %d");
    local_1c = 0x80;
  }
  if (0x400000 < local_1c) {
    post("sigmund~: maximum points %d");
    local_1c = 0x400000;
  }
  uVar2 = sigmund_ilog2(local_1c);
  if (local_1c != 1 << ((byte)uVar2 & 0x1f)) {
    uVar2 = sigmund_ilog2(local_1c);
    local_1c = 1 << ((byte)uVar2 & 0x1f);
    post("sigmund~: adjusting analysis size to %d points");
  }
  if (local_1c != iVar1) {
    x->x_infill = 0;
    x->x_countdown = 0;
  }
  if (x->x_mode == 1) {
    if (x->x_inbuf == (t_sample *)0x0) {
      ptVar3 = (t_sample *)getbytes((long)local_1c << 2);
      x->x_inbuf = ptVar3;
      memset(x->x_inbuf,0,(long)local_1c << 2);
    }
    else {
      ptVar3 = (t_sample *)resizebytes(x->x_inbuf,(long)iVar1 << 2,(long)local_1c << 2);
      x->x_inbuf = ptVar3;
    }
  }
  else {
    x->x_inbuf = (t_sample *)0x0;
  }
  x->x_npts = local_1c;
  return;
}

Assistant:

static void sigmund_npts(t_sigmund *x, t_floatarg f)
{
    int nwas = x->x_npts, npts = f;
        /* check parameter ranges */
    if (npts < NPOINTS_MIN)
        post("sigmund~: minimum points %d", NPOINTS_MIN),
            npts = NPOINTS_MIN;
    if (npts > NPOINTS_MAX)
        post("sigmund~: maximum points %d", NPOINTS_MAX),
            npts = NPOINTS_MAX;

    if (npts != (1 << sigmund_ilog2(npts)))
        post("sigmund~: adjusting analysis size to %d points",
            (npts = (1 << sigmund_ilog2(npts))));
    if (npts != nwas)
        x->x_countdown = x->x_infill  = 0;
    if (x->x_mode == MODE_STREAM)
    {
        if (x->x_inbuf)
        {
            x->x_inbuf = (t_sample *)t_resizebytes(x->x_inbuf,
                sizeof(*x->x_inbuf) * nwas, sizeof(*x->x_inbuf) * npts);
#ifdef MSP
            x->x_inbuf2 = (t_sample *)t_resizebytes(x->x_inbuf2,
                sizeof(*x->x_inbuf2) * nwas, sizeof(*x->x_inbuf2) * npts);
#endif
        }
        else
        {
            x->x_inbuf = (t_sample *)getbytes(sizeof(*x->x_inbuf) * npts);
            memset((char *)(x->x_inbuf), 0, sizeof(*x->x_inbuf) * npts);
#ifdef MSP
            x->x_inbuf2 = (t_sample *)getbytes(sizeof(*x->x_inbuf2) * npts);
            memset((char *)(x->x_inbuf2), 0, sizeof(*x->x_inbuf2) * npts);
#endif
        }
    }
    else x->x_inbuf = 0;
    x->x_npts = npts;
}